

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void lts2::ImageWaveletScale(Mat *src,Mat *dest,double *P,double *Q,int fsize,int scale,int *rscale)

{
  double *pdVar1;
  double *pdVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  size_type sVar8;
  ulong uVar9;
  reference pvVar10;
  _InputArray *p_Var11;
  void *pvVar12;
  void *pvVar13;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  float local_554;
  float local_52c;
  _OutputArray local_490;
  _InputArray local_478;
  Scalar_<double> local_460;
  Mat local_440 [352];
  MatExpr local_2e0 [356];
  int local_17c;
  int local_178;
  int i;
  int j;
  int local_16c;
  int local_168;
  int b_2;
  int k_1;
  int k;
  int b_1;
  int num;
  int height;
  int width;
  int local_134;
  void *pvStack_130;
  int b;
  double *omax;
  double *omin;
  _InputArray local_108;
  undefined1 local_f0 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> dest_components;
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  Size_<int> local_b0;
  Size imageSize;
  float c;
  float a;
  float *max;
  float *min;
  Mat ret;
  int scale_local;
  int fsize_local;
  double *Q_local;
  double *P_local;
  Mat *dest_local;
  Mat *src_local;
  
  cv::Mat::Mat((Mat *)&min);
  cv::MatSize::operator()((MatSize *)&local_b0);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
             &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_f0);
  cv::_InputArray::_InputArray(&local_108,src);
  cv::_OutputArray::_OutputArray
            ((_OutputArray *)&omin,
             (vector<cv::Mat,_std::allocator<cv::Mat>_> *)
             &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::split(&local_108,(_OutputArray *)&omin);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&omin);
  cv::_InputArray::~_InputArray(&local_108);
  sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                    ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                     &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar8;
  uVar9 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  omax = (double *)operator_new__(uVar9);
  sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                    ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                     &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = sVar8;
  uVar9 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvStack_130 = operator_new__(uVar9);
  local_134 = 0;
  while( true ) {
    uVar9 = (ulong)local_134;
    sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                      ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                       &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar8 <= uVar9) break;
    pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                        ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                         &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_134);
    cv::_InputArray::_InputArray((_InputArray *)&height,pvVar10);
    pdVar1 = omax + local_134;
    pdVar2 = (double *)((long)pvStack_130 + (long)local_134 * 8);
    p_Var11 = (_InputArray *)cv::noArray();
    cv::minMaxLoc((_InputArray *)&height,pdVar1,pdVar2,(Point_ *)0x0,(Point_ *)0x0,p_Var11);
    cv::_InputArray::~_InputArray((_InputArray *)&height);
    local_134 = local_134 + 1;
  }
  num = *(int *)(src + 0xc);
  b_1 = *(int *)(src + 8);
  k = 1;
  while( true ) {
    bVar17 = false;
    if ((((k <= scale) && (bVar17 = false, fsize <= num)) && (bVar17 = false, fsize <= b_1)) &&
       (bVar17 = false, num % 2 == 0)) {
      bVar17 = b_1 % 2 == 0;
    }
    if (!bVar17) break;
    k_1 = 0;
    while( true ) {
      uVar9 = (ulong)k_1;
      sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                        ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                         &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar8 <= uVar9) break;
      for (b_2 = 0; b_2 < b_1; b_2 = b_2 + 1) {
        pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                             &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)k_1);
        Wavegeneral_h(pvVar10,b_2,num,0,P,Q,fsize);
      }
      for (local_168 = 0; local_168 < num; local_168 = local_168 + 1) {
        pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                             &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)k_1);
        Wavegeneral_v(pvVar10,local_168,b_1,0,P,Q,fsize);
      }
      k_1 = k_1 + 1;
    }
    num = num / 2;
    b_1 = b_1 / 2;
    k = k + 1;
  }
  sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                    ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                     &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_f0,sVar8);
  sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                    ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                     &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar8;
  uVar9 = SUB168(auVar6 * ZEXT816(4),0);
  if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar12 = operator_new__(uVar9);
  sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                    ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                     &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = sVar8;
  uVar9 = SUB168(auVar7 * ZEXT816(4),0);
  if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar9);
  local_16c = 0;
  while( true ) {
    uVar9 = (ulong)local_16c;
    sVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                      ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                       &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar8 <= uVar9) break;
    pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                        ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                         &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_16c);
    pfVar14 = cv::Mat::at<float>(pvVar10,0,0);
    fVar3 = *pfVar14;
    *(float *)((long)pvVar13 + (long)local_16c * 4) = fVar3;
    *(float *)((long)pvVar12 + (long)local_16c * 4) = fVar3;
    pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                        ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_f0,(long)local_16c);
    cv::Size_<int>::Size_((Size_<int> *)&i,&local_b0);
    cv::Mat::create(pvVar10,&i,5);
    for (local_178 = 0; local_178 < b_1; local_178 = local_178 + 1) {
      for (local_17c = 0; local_17c < num; local_17c = local_17c + 1) {
        pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                             &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_16c);
        pfVar15 = cv::Mat::at<float>(pvVar10,local_178,local_17c);
        pfVar14 = (float *)((long)pvVar12 + (long)local_16c * 4);
        if (*pfVar15 < *pfVar14 || *pfVar15 == *pfVar14) {
          pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                               &dest_components.
                                super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)local_16c);
          pfVar14 = cv::Mat::at<float>(pvVar10,local_178,local_17c);
          local_52c = *pfVar14;
        }
        else {
          local_52c = *(float *)((long)pvVar12 + (long)local_16c * 4);
        }
        *(float *)((long)pvVar12 + (long)local_16c * 4) = local_52c;
        pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                             &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_16c);
        pfVar14 = cv::Mat::at<float>(pvVar10,local_178,local_17c);
        if (*(float *)((long)pvVar13 + (long)local_16c * 4) <= *pfVar14) {
          pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                               &dest_components.
                                super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)local_16c);
          pfVar14 = cv::Mat::at<float>(pvVar10,local_178,local_17c);
          local_554 = *pfVar14;
        }
        else {
          local_554 = *(float *)((long)pvVar13 + (long)local_16c * 4);
        }
        *(float *)((long)pvVar13 + (long)local_16c * 4) = local_554;
      }
    }
    lVar16 = (long)local_16c;
    imageSize.height =
         (int)(float)((*(double *)((long)pvStack_130 + lVar16 * 8) - omax[lVar16]) /
                     (double)(*(float *)((long)pvVar13 + lVar16 * 4) -
                             *(float *)((long)pvVar12 + lVar16 * 4)));
    lVar16 = (long)local_16c;
    fVar3 = *(float *)((long)pvVar12 + lVar16 * 4);
    imageSize.width =
         (int)(float)(omax[lVar16] -
                     ((double)fVar3 * (*(double *)((long)pvStack_130 + lVar16 * 8) - omax[lVar16]))
                     / (double)(*(float *)((long)pvVar13 + lVar16 * 4) - fVar3));
    dVar18 = (double)(float)imageSize.height;
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(long)local_16c);
    cv::operator*(dVar18,local_440);
    cv::Scalar_<double>::Scalar_(&local_460,(double)(float)imageSize.width);
    cv::operator+(local_2e0,(Scalar_ *)local_440);
    pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                        ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_f0,(long)local_16c);
    cv::Mat::operator=(pvVar10,local_2e0);
    cv::MatExpr::~MatExpr(local_2e0);
    cv::MatExpr::~MatExpr((MatExpr *)local_440);
    local_16c = local_16c + 1;
  }
  cv::_InputArray::_InputArray(&local_478,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_f0);
  cv::_OutputArray::_OutputArray(&local_490,dest);
  cv::merge(&local_478,&local_490);
  cv::_OutputArray::~_OutputArray(&local_490);
  cv::_InputArray::~_InputArray(&local_478);
  if (scale == 0) {
    *rscale = 0;
  }
  else {
    *rscale = k + -1;
  }
  if (pvVar12 != (void *)0x0) {
    operator_delete__(pvVar12);
  }
  if (pvVar13 != (void *)0x0) {
    operator_delete__(pvVar13);
  }
  if (omax != (double *)0x0) {
    operator_delete__(omax);
  }
  if (pvStack_130 != (void *)0x0) {
    operator_delete__(pvStack_130);
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_f0);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
             &dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)&min);
  return;
}

Assistant:

void lts2::ImageWaveletScale(const cv::Mat& src, cv::Mat& dest, double *P, double *Q, int fsize, int scale, int *rscale)
{
  cv::Mat ret;
  float *min, *max, a, c;
	
  cv::Size imageSize = src.size();
        
  std::vector<cv::Mat> components, dest_components;
  cv::split(src, components);
    
  double *omin = new double[components.size()];
  double *omax = new double[components.size()];
    
  for (int b = 0; b < components.size(); ++b)
    cv::minMaxLoc(components.at(b), &omin[b], &omax[b]);
	
  int width = src.cols;
  int height = src.rows;
  int num = 1;
	
  while(num<=scale && width>=fsize && height>=fsize && !(width%2) && !(height%2)) 
  {
    for (int b = 0; b < components.size(); ++b) 
    {
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, 0, P, Q, fsize);
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, 0, P, Q, fsize);
    }
    width /= 2; 
    height /= 2;
    ++num;
  }
    
  dest_components.reserve(components.size());
    	
  min = new float[components.size()];
  max = new float[components.size()];
    
  for (int b = 0; b < components.size(); ++b) 
  {
    min[b] = max[b] = components.at(b).at<float>(0, 0);
    dest_components.at(b).create(imageSize, CV_32FC1);
        
    for(int j = 0; j < height; ++j) 
    {
      for(int i = 0; i < width; ++i) 
      {
        min[b] = MIN(components.at(b).at<float>(j, i), min[b]);
        max[b] = MAX(components.at(b).at<float>(j, i), max[b]);
      }
    }
    a = (omax[b] - omin[b]) / (max[b] - min[b]);
    c = omin[b] - min[b]*(omax[b] - omin[b]) / (max[b] - min[b]);
        
    dest_components.at(b) = a * components.at(b) + c;
  }
    
  cv::merge(dest_components, dest);
    
  if (scale != 0) 
    *rscale = num - 1;
  else 
    *rscale = 0;
    
  delete[] min;
  delete[] max;
  delete[] omin;
  delete[] omax;
	
  return;
}